

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O3

QString * __thiscall QVersionNumber::toString(QString *__return_storage_ptr__,QVersionNumber *this)

{
  ArrayOptions *pAVar1;
  byte bVar2;
  Data *pDVar3;
  QList<int> *pQVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  int n;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar2 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar2 & 1) == 0) {
    lVar7 = (((this->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar7 = (long)((char)bVar2 >> 1);
  }
  lVar8 = 1;
  if (1 < lVar7 * 2) {
    lVar8 = lVar7 * 2;
  }
  QString::reallocData(__return_storage_ptr__,lVar8 + -1,KeepSize);
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  bVar5 = true;
  uVar9 = 0;
  do {
    bVar2 = (this->m_segments).field_0.inline_segments[0];
    uVar6 = (ulong)bVar2;
    if ((bVar2 & 1) == 0) {
      uVar6 = (this->m_segments).field_0.dummy;
      lVar7 = *(long *)(uVar6 + 0x10);
    }
    else {
      lVar7 = (long)((char)bVar2 >> 1);
    }
    if (lVar7 <= (long)uVar9) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if (!bVar5) {
      QString::append(__return_storage_ptr__,(QChar)0x2e);
      uVar6 = (ulong)(byte)(this->m_segments).field_0.inline_segments[0];
    }
    if ((uVar6 & 1) == 0) {
      pQVar4 = (this->m_segments).field_0.pointer_segments;
      if (uVar9 < (ulong)(pQVar4->d).size) {
        n = (pQVar4->d).ptr[uVar9];
      }
      else {
LAB_0038ac98:
        n = 0;
      }
    }
    else {
      if ((long)(char)((char)uVar6 >> 1) <= (long)uVar9) goto LAB_0038ac98;
      n = (int)(this->m_segments).field_0.inline_segments[uVar9 + 1];
    }
    QString::number(&local_40,n,10);
    QString::append(__return_storage_ptr__,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar9 = uVar9 + 1;
    bVar5 = false;
  } while( true );
}

Assistant:

QString QVersionNumber::toString() const
{
    QString version;
    version.reserve(qMax(segmentCount() * 2 - 1, 0));
    bool first = true;
    for (qsizetype i = 0; i < segmentCount(); ++i) {
        if (!first)
            version += u'.';
        version += QString::number(segmentAt(i));
        first = false;
    }
    return version;
}